

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enable_shared_from_this4.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_38 [8];
  shared_ptr<A> p;
  shared_ptr<A> x;
  char **argv_local;
  int argc_local;
  
  std::make_shared<A>();
  std::__shared_ptr_access<A,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<A,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &p.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  A::f((A *)local_38);
  std::shared_ptr<A>::~shared_ptr((shared_ptr<A> *)local_38);
  std::shared_ptr<A>::~shared_ptr
            ((shared_ptr<A> *)&p.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	shared_ptr<A> x = make_shared<A>();
	shared_ptr<A> p = x->f();
	return 0;
}